

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O2

int gost_mgm128_finish(mgm128_context *ctx,uchar *tag,size_t len)

{
  anon_union_16_3_4e909ff4_for_nonce_Yi_Zi_EKi_Hi_len_ACi_mul_sum_tag *result;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint64_t uVar4;
  block128_f p_Var5;
  mul128_f p_Var6;
  void *pvVar7;
  int iVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar9 = (ctx->len).u[0];
  uVar4 = (ctx->len).u[1];
  uVar1 = uVar9 * 8;
  uVar2 = uVar4 * 8;
  p_Var5 = ctx->block;
  p_Var6 = ctx->mul_gf;
  pvVar7 = ctx->key;
  iVar8 = ctx->blocklen;
  uVar10 = ctx->mres;
  uVar3 = ctx->ares;
  if (uVar10 != 0 || uVar3 != 0) {
    memset((void *)((long)&ctx->ACi + (ulong)uVar10 + (ulong)uVar3),0,
           (ulong)(iVar8 - (uVar10 + uVar3)));
    (*p_Var5)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar7);
    (*p_Var6)((ctx->mul).u,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
    grasshopper_plus128((grasshopper_w128_t *)&ctx->sum,(grasshopper_w128_t *)&ctx->sum,
                        (grasshopper_w128_t *)&ctx->mul);
    inc_counter((uchar *)(ctx->Zi).u,(long)(iVar8 / 2));
  }
  uVar10 = (uint)uVar9;
  uVar11 = uVar9 << 0x3b | uVar1 >> 0x38 | (ulong)(uVar10 & 0x1fe00000) << 0xb |
           (ulong)(uVar10 & 0x1fe000) << 0x1b | (ulong)(uVar10 & 0x1fe0) << 0x2b;
  uVar10 = (uint)uVar4;
  uVar12 = uVar4 << 0x3b | uVar2 >> 0x38 | (ulong)(uVar10 & 0x1fe00000) << 0xb |
           (ulong)(uVar10 & 0x1fe000) << 0x1b | (ulong)(uVar10 & 0x1fe0) << 0x2b |
           uVar2 >> 0x28 & 0xff00 | uVar2 >> 0x18 & 0xff0000 |
           (ulong)((uint)(uVar2 >> 8) & 0xff000000);
  uVar9 = 0;
  uVar2 = uVar11 >> 0x20 | uVar12;
  if (iVar8 == 0x10) {
    uVar9 = uVar12;
    uVar2 = uVar1 >> 0x28 & 0xff00 | uVar11 |
            (ulong)((uint)(uVar1 >> 8) & 0xff000000) | uVar1 >> 0x18 & 0xff0000;
  }
  (ctx->len).u[0] = uVar2;
  (ctx->len).u[1] = uVar9;
  (*p_Var5)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar7);
  (*p_Var6)((ctx->mul).u,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->len);
  result = &ctx->sum;
  grasshopper_plus128((grasshopper_w128_t *)result,(grasshopper_w128_t *)result,
                      (grasshopper_w128_t *)&ctx->mul);
  (*p_Var5)((uchar *)result->u,(uchar *)&ctx->tag,pvVar7);
  if (0x10 < len || tag == (uchar *)0x0) {
    return -1;
  }
  iVar8 = CRYPTO_memcmp(&ctx->tag,tag,len);
  return iVar8;
}

Assistant:

int gost_mgm128_finish(mgm128_context *ctx, const unsigned char *tag,
                         size_t len)
{
    uint64_t alen = ctx->len.u[0] << 3;
    uint64_t clen = ctx->len.u[1] << 3;
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->mres || ctx->ares) {
        /* First call to encrypt finalizes AAD/ENC */
        memset(ctx->ACi.c + ctx->ares + ctx->mres, 0, bl - (ctx->ares + ctx->mres));
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) [A_i or C_i]
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
    }

#ifdef L_ENDIAN
    alen = BSWAP64(alen);
    clen = BSWAP64(clen);
#endif
    if (bl == 16) {
        ctx->len.u[0] = alen;
        ctx->len.u[1] = clen;
    } else {
#ifdef L_ENDIAN
        ctx->len.u[0] = (alen >> 32) | clen;
#else
        ctx->len.u[0] = (alen << 32) | clen;
#endif
        ctx->len.u[1] = 0;
    }

    (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
    mul_gf(ctx->mul.u, ctx->Hi.u, ctx->len.u);              // H_i (x) (len(A) || len(C))
    grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
    (*block) (ctx->sum.c, ctx->tag.c, key);                 // E_K(sum)

    if (tag && len <= sizeof(ctx->tag))
        return CRYPTO_memcmp(ctx->tag.c, tag, len);         // MSB_S(E_K(sum))
    else
        return -1;
}